

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O2

DdNode * Llb_Nonlin4ComputeBad(DdManager *dd,Aig_Man_t *pAig,Vec_Int_t *vOrder)

{
  int i;
  DdNode *pDVar1;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *p;
  void *pvVar2;
  DdNode *pDVar3;
  DdNode *n;
  DdNode *n_00;
  int iVar4;
  
  Aig_ManCleanData(pAig);
  pDVar1 = Cudd_ReadOne(dd);
  (pAig->pConst1->field_5).pData = pDVar1;
  for (iVar4 = 0; iVar4 < pAig->vCis->nSize; iVar4 = iVar4 + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,iVar4);
    i = Llb_ObjBddVar(vOrder,pObj);
    pDVar1 = Cudd_bddIthVar(dd,i);
    (pObj->field_5).pData = pDVar1;
  }
  p = Aig_ManDfsNodes(pAig,(Aig_Obj_t **)pAig->vCos->pArray,pAig->nTruePos);
  for (iVar4 = 0; iVar4 < p->nSize; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(p,iVar4);
    if (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7) {
      pDVar1 = Cudd_bddAnd(dd,(DdNode *)
                              ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^
                              *(ulong *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x28)
                              ),(DdNode *)
                                ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^
                                *(ulong *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) +
                                          0x28)));
      if (pDVar1 == (DdNode *)0x0) {
        for (iVar4 = 0; iVar4 < p->nSize; iVar4 = iVar4 + 1) {
          pvVar2 = Vec_PtrEntry(p,iVar4);
          if ((0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7) &&
             (*(DdNode **)((long)pvVar2 + 0x28) != (DdNode *)0x0)) {
            Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar2 + 0x28));
          }
        }
        Vec_PtrFree(p);
        return (DdNode *)0x0;
      }
      Cudd_Ref(pDVar1);
      *(DdNode **)((long)pvVar2 + 0x28) = pDVar1;
    }
  }
  pDVar1 = Cudd_ReadLogicZero(dd);
  Cudd_Ref(pDVar1);
  iVar4 = 0;
  do {
    if (pAig->nTruePos <= iVar4) {
LAB_0069015b:
      for (iVar4 = 0; iVar4 < p->nSize; iVar4 = iVar4 + 1) {
        pvVar2 = Vec_PtrEntry(p,iVar4);
        if ((0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7) &&
           (*(DdNode **)((long)pvVar2 + 0x28) != (DdNode *)0x0)) {
          Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar2 + 0x28));
        }
      }
      Vec_PtrFree(p);
      pDVar3 = (DdNode *)0x0;
      if (pDVar1 != (DdNode *)0x0) {
        n = Cudd_ReadOne(dd);
        Cudd_Ref(n);
        while (iVar4 = (int)pDVar3, iVar4 < pAig->nTruePis) {
          pvVar2 = Vec_PtrEntry(pAig->vCis,iVar4);
          n_00 = Cudd_bddAnd(dd,n,*(DdNode **)((long)pvVar2 + 0x28));
          if (n_00 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,n);
            Cudd_RecursiveDeref(dd,pDVar1);
            return (DdNode *)0x0;
          }
          Cudd_Ref(n_00);
          Cudd_RecursiveDeref(dd,n);
          n = n_00;
          pDVar3 = (DdNode *)(ulong)(iVar4 + 1);
        }
        pDVar3 = Cudd_bddExistAbstract(dd,pDVar1,n);
        Cudd_Ref(pDVar3);
        Cudd_RecursiveDeref(dd,pDVar1);
        Cudd_RecursiveDeref(dd,n);
        Cudd_Deref(pDVar3);
      }
      return pDVar3;
    }
    pvVar2 = Vec_PtrEntry(pAig->vCos,iVar4);
    pDVar3 = Cudd_bddOr(dd,pDVar1,
                        (DdNode *)
                        ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^
                        *(ulong *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x28)));
    if (pDVar3 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,pDVar1);
      pDVar1 = (DdNode *)0x0;
      goto LAB_0069015b;
    }
    Cudd_Ref(pDVar3);
    Cudd_RecursiveDeref(dd,pDVar1);
    iVar4 = iVar4 + 1;
    pDVar1 = pDVar3;
  } while( true );
}

Assistant:

DdNode * Llb_Nonlin4ComputeBad( DdManager * dd, Aig_Man_t * pAig, Vec_Int_t * vOrder )
{
    Vec_Ptr_t * vNodes;
    DdNode * bBdd, * bBdd0, * bBdd1, * bTemp, * bResult, * bCube;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManCleanData( pAig );
    // assign elementary variables
    Aig_ManConst1(pAig)->pData = Cudd_ReadOne(dd); 
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
    // compute internal nodes
    vNodes = Aig_ManDfsNodes( pAig, (Aig_Obj_t **)Vec_PtrArray(pAig->vCos), Saig_ManPoNum(pAig) );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
        bBdd  = Cudd_bddAnd( dd, bBdd0, bBdd1 );
        if ( bBdd == NULL )
        {
            Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
                if ( Aig_ObjIsNode(pObj) && pObj->pData != NULL )
                    Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
            Vec_PtrFree( vNodes );
            return NULL;
        }
        Cudd_Ref( bBdd );
        pObj->pData = bBdd;
    }
    // quantify PIs of each PO
    bResult = Cudd_ReadLogicZero( dd );  Cudd_Ref( bResult );
    Saig_ManForEachPo( pAig, pObj, i )
    {
        bBdd0   = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bResult = Cudd_bddOr( dd, bTemp = bResult, bBdd0 );     
        if ( bResult == NULL )
        {
            Cudd_RecursiveDeref( dd, bTemp );
            break;
        }
        Cudd_Ref( bResult );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    // deref
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        if ( Aig_ObjIsNode(pObj) && pObj->pData != NULL )
            Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    Vec_PtrFree( vNodes );
    if ( bResult )
    {
        bCube = Cudd_ReadOne(dd);  Cudd_Ref( bCube );
        Saig_ManForEachPi( pAig, pObj, i )
        {
            bCube = Cudd_bddAnd( dd, bTemp = bCube, (DdNode *)pObj->pData );  
            if ( bCube == NULL )
            {
                Cudd_RecursiveDeref( dd, bTemp );
                Cudd_RecursiveDeref( dd, bResult );
                bResult = NULL;
                break;
            }
            Cudd_Ref( bCube );
            Cudd_RecursiveDeref( dd, bTemp );
        }
        if ( bResult != NULL )
        {
            bResult = Cudd_bddExistAbstract( dd, bTemp = bResult, bCube );  Cudd_Ref( bResult );
            Cudd_RecursiveDeref( dd, bTemp );
            Cudd_RecursiveDeref( dd, bCube );
            Cudd_Deref( bResult );
        }
    }
//if ( bResult )
//printf( "Bad state = %d.\n", Cudd_DagSize(bResult) );
    return bResult;
}